

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O0

CVmUndoRecord * __thiscall CVmUndo::add_new_record(CVmUndo *this,vm_obj_id_t controlling_obj)

{
  int iVar1;
  CVmUndo *in_RDI;
  CVmUndoMeta *meta;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  CVmObjTable *in_stack_ffffffffffffffd0;
  CVmUndoMeta *local_8;
  
  if (in_RDI->savept_cnt_ == 0) {
    local_8 = (CVmUndoMeta *)0x0;
  }
  else {
    iVar1 = CVmObjTable::is_obj_in_undo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (iVar1 == 0) {
      local_8 = (CVmUndoMeta *)0x0;
    }
    else {
      local_8 = alloc_rec(in_RDI);
      if (local_8 == (CVmUndoMeta *)0x0) {
        local_8 = (CVmUndoMeta *)0x0;
      }
    }
  }
  return (CVmUndoRecord *)local_8;
}

Assistant:

CVmUndoRecord *CVmUndo::add_new_record(VMG_ vm_obj_id_t controlling_obj)
{
    CVmUndoMeta *meta;
    
    /* if there is not an active savepoint, do not keep undo */
    if (savept_cnt_ == 0)
        return 0;

    /* 
     *   if the object was created after the current savepoint was created,
     *   there is no need to keep undo for it during this savepoint, since
     *   rolling back to the savepoint will roll back to a point at which
     *   the object didn't even exist 
     */
    if (!G_obj_table->is_obj_in_undo(controlling_obj))
        return 0;
    
    /* allocate a new record */
    meta = alloc_rec(vmg0_);
    
    /* return the undo record, if we succeeded */
    return (meta == 0 ? 0 : &meta->rec);
}